

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519-donna-helpers.h
# Opt level: O2

void curve25519_recip(uint64_t *out,uint64_t *z)

{
  bignum25519 b;
  bignum25519 t0;
  bignum25519 a;
  
  curve25519_square_times(a,z,1);
  curve25519_square_times(t0,a,2);
  curve25519_mul_noinline(b,t0,z);
  curve25519_mul_noinline(a,b,a);
  curve25519_square_times(t0,a,1);
  curve25519_mul_noinline(b,t0,b);
  curve25519_pow_two5mtwo0_two250mtwo0(b);
  curve25519_square_times(b,b,5);
  curve25519_mul_noinline(out,b,a);
  return;
}

Assistant:

static void
curve25519_recip(bignum25519 out, const bignum25519 z) {
	bignum25519 ALIGN(16) a,t0,b;

	/* 2 */ curve25519_square_times(a, z, 1); /* a = 2 */
	/* 8 */ curve25519_square_times(t0, a, 2);
	/* 9 */ curve25519_mul_noinline(b, t0, z); /* b = 9 */
	/* 11 */ curve25519_mul_noinline(a, b, a); /* a = 11 */
	/* 22 */ curve25519_square_times(t0, a, 1);
	/* 2^5 - 2^0 = 31 */ curve25519_mul_noinline(b, t0, b);
	/* 2^250 - 2^0 */ curve25519_pow_two5mtwo0_two250mtwo0(b);
	/* 2^255 - 2^5 */ curve25519_square_times(b, b, 5);
	/* 2^255 - 21 */ curve25519_mul_noinline(out, b, a);
}